

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeFactory.cpp
# Opt level: O2

Executable * ExeFactory::build(AbstractByteBuffer *buf,exe_type type)

{
  mapped_type pEVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *ppEVar4;
  undefined4 extraout_var;
  exe_type local_1c;
  
  local_1c = type;
  init((EVP_PKEY_CTX *)buf);
  iVar3 = std::
          _Rb_tree<ExeFactory::exe_type,_std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>,_std::_Select1st<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>,_std::less<ExeFactory::exe_type>,_std::allocator<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>_>
          ::find(&builders._M_t,&local_1c);
  if ((_Rb_tree_header *)iVar3._M_node != &builders._M_t._M_impl.super__Rb_tree_header) {
    ppEVar4 = std::
              map<ExeFactory::exe_type,_ExeBuilder_*,_std::less<ExeFactory::exe_type>,_std::allocator<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>_>
              ::operator[](&builders,&local_1c);
    pEVar1 = *ppEVar4;
    if (pEVar1 != (mapped_type)0x0) {
      iVar2 = (*pEVar1->_vptr_ExeBuilder[3])(pEVar1,buf);
      return (Executable *)CONCAT44(extraout_var,iVar2);
    }
  }
  return (Executable *)0x0;
}

Assistant:

Executable* ExeFactory::build(AbstractByteBuffer *buf, exe_type type)
{
    ExeFactory::init(); //ensue that the builders are initialized

    if (builders.find(type) == builders.end()) {
        return NULL;
    }
    ExeBuilder* builder = builders[type];
    if (!builder) return NULL;

    return builder->build(buf);
}